

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaForce.c
# Opt level: O0

Frc_Man_t * Frc_ManStart(Gia_Man_t *pGia)

{
  Frc_Obj_t *pFVar1;
  Frc_Man_t *pFVar2;
  uint uVar3;
  int iVar4;
  Vec_Int_t *pVVar5;
  void *pvVar6;
  Gia_Obj_t *pGVar7;
  bool bVar8;
  uint local_60;
  int local_5c;
  int hHandle;
  int k;
  int i;
  int nNodes;
  int nFanios;
  int nObjs;
  Vec_Int_t *vVisit;
  Vec_Int_t *vSuper;
  Gia_Obj_t *pFanin;
  Gia_Obj_t *pObj;
  Frc_Obj_t *pFanLog;
  Frc_Obj_t *pObjLog;
  Frc_Man_t *p;
  Gia_Man_t *pGia_local;
  
  p = (Frc_Man_t *)pGia;
  Frc_ManCreateRefsSpecial(pGia);
  Frc_ManTransformRefs((Gia_Man_t *)p,&nNodes,&i);
  Gia_ManFillValue((Gia_Man_t *)p);
  pObjLog = (Frc_Obj_t *)calloc(1,0x38);
  *(Frc_Man_t **)pObjLog = p;
  uVar3 = Gia_ManRegNum((Gia_Man_t *)p);
  pObjLog[1].nFanouts = uVar3;
  iVar4 = Gia_ManCiNum((Gia_Man_t *)p);
  pVVar5 = Vec_IntAlloc(iVar4);
  *(Vec_Int_t **)&pObjLog->iFanout = pVVar5;
  iVar4 = Gia_ManCoNum((Gia_Man_t *)p);
  pVVar5 = Vec_IntAlloc(iVar4);
  *(Vec_Int_t **)&pObjLog->pPlace = pVVar5;
  pObjLog[1].pPlace = nNodes * 6 + i * 2;
  pvVar6 = calloc((long)pObjLog[1].pPlace,4);
  *(void **)&pObjLog[1].iFanout = pvVar6;
  pGVar7 = Gia_ManConst0((Gia_Man_t *)p);
  pGVar7->Value = 0;
  pFanLog = Frc_ManObj((Frc_Man_t *)pObjLog,0);
  pFVar2 = p;
  pFanLog->hHandle = 0;
  *(uint *)pFanLog = *(uint *)pFanLog & 0xf;
  pGVar7 = Gia_ManConst0((Gia_Man_t *)p);
  uVar3 = Gia_ObjRefNum((Gia_Man_t *)pFVar2,pGVar7);
  pFanLog->nFanouts = uVar3;
  local_60 = Frc_ObjSize(pFanLog);
  k = 1;
  *(int *)(pObjLog + 1) = *(int *)(pObjLog + 1) + 1;
  hHandle = 0;
  while( true ) {
    iVar4 = Vec_IntSize(p[1].vCis);
    bVar8 = false;
    if (hHandle < iVar4) {
      pFanin = Gia_ManCi((Gia_Man_t *)p,hHandle);
      bVar8 = pFanin != (Gia_Obj_t *)0x0;
    }
    if (!bVar8) break;
    pFanin->Value = local_60;
    Vec_IntPush(*(Vec_Int_t **)&pObjLog->iFanout,local_60);
    pFanLog = Frc_ManObj((Frc_Man_t *)pObjLog,local_60);
    pFanLog->hHandle = local_60;
    *(uint *)pFanLog = *(uint *)pFanLog & 0xf;
    uVar3 = Gia_ObjRefNum((Gia_Man_t *)p,pFanin);
    pFanLog->nFanouts = uVar3;
    *(uint *)pFanLog = *(uint *)pFanLog & 0xfffffffe | 1;
    iVar4 = Frc_ObjSize(pFanLog);
    local_60 = iVar4 + local_60;
    *(int *)(pObjLog + 1) = *(int *)(pObjLog + 1) + 1;
    hHandle = hHandle + 1;
  }
  vVisit = Vec_IntAlloc(100);
  _nFanios = Vec_IntAlloc(100);
  hHandle = 0;
  while( true ) {
    bVar8 = false;
    if (hHandle < p->nObjs) {
      pFanin = Gia_ManObj((Gia_Man_t *)p,hHandle);
      bVar8 = pFanin != (Gia_Obj_t *)0x0;
    }
    if (!bVar8) break;
    iVar4 = Gia_ObjIsAnd(pFanin);
    if (iVar4 != 0) {
      if ((*(ulong *)pFanin >> 0x1e & 1) == 0) {
        iVar4 = Gia_ObjRefNum((Gia_Man_t *)p,pFanin);
        if (iVar4 != 0) {
          __assert_fail("Gia_ObjRefNum( pGia, pObj ) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaForce.c"
                        ,0x1e1,"Frc_Man_t *Frc_ManStart(Gia_Man_t *)");
        }
      }
      else {
        iVar4 = Gia_ObjRefNum((Gia_Man_t *)p,pFanin);
        if (iVar4 < 1) {
          __assert_fail("Gia_ObjRefNum( pGia, pObj ) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaForce.c"
                        ,0x1e4,"Frc_Man_t *Frc_ManStart(Gia_Man_t *)");
        }
        Frc_ManCollectSuper((Gia_Man_t *)p,pFanin,vVisit,_nFanios);
        pFanin->Value = local_60;
        pFanLog = Frc_ManObj((Frc_Man_t *)pObjLog,local_60);
        pFanLog->hHandle = local_60;
        iVar4 = Vec_IntSize(vVisit);
        *(uint *)pFanLog = *(uint *)pFanLog & 0xf | iVar4 << 4;
        uVar3 = Gia_ObjRefNum((Gia_Man_t *)p,pFanin);
        pFanLog->nFanouts = uVar3;
        local_5c = 0;
        while( true ) {
          iVar4 = Vec_IntSize(vVisit);
          pFVar2 = p;
          bVar8 = false;
          if (local_5c < iVar4) {
            iVar4 = Vec_IntEntry(vVisit,local_5c);
            vSuper = (Vec_Int_t *)Gia_ManObj((Gia_Man_t *)pFVar2,iVar4);
            bVar8 = vSuper != (Vec_Int_t *)0x0;
          }
          pFVar1 = pObjLog;
          if (!bVar8) break;
          iVar4 = Gia_ObjValue((Gia_Obj_t *)vSuper);
          pObj = (Gia_Obj_t *)Frc_ManObj((Frc_Man_t *)pFVar1,iVar4);
          Frc_ObjAddFanin(pFanLog,(Frc_Obj_t *)pObj);
          local_5c = local_5c + 1;
        }
        iVar4 = Frc_ObjSize(pFanLog);
        local_60 = iVar4 + local_60;
        k = k + 1;
        *(int *)(pObjLog + 1) = *(int *)(pObjLog + 1) + 1;
      }
    }
    hHandle = hHandle + 1;
  }
  Vec_IntFree(vVisit);
  Vec_IntFree(_nFanios);
  hHandle = 0;
  while( true ) {
    iVar4 = Vec_IntSize(p[1].vCos);
    bVar8 = false;
    if (hHandle < iVar4) {
      pFanin = Gia_ManCo((Gia_Man_t *)p,hHandle);
      bVar8 = pFanin != (Gia_Obj_t *)0x0;
    }
    if (!bVar8) break;
    pFanin->Value = local_60;
    Vec_IntPush(*(Vec_Int_t **)&pObjLog->pPlace,local_60);
    pFanLog = Frc_ManObj((Frc_Man_t *)pObjLog,local_60);
    pFVar1 = pObjLog;
    pFanLog->hHandle = local_60;
    *(uint *)pFanLog = *(uint *)pFanLog & 0xf | 0x10;
    pFanLog->nFanouts = 0;
    *(uint *)pFanLog = *(uint *)pFanLog & 0xfffffffd | 2;
    pGVar7 = Gia_ObjFanin0(pFanin);
    iVar4 = Gia_ObjValue(pGVar7);
    pObj = (Gia_Obj_t *)Frc_ManObj((Frc_Man_t *)pFVar1,iVar4);
    Frc_ObjAddFanin(pFanLog,(Frc_Obj_t *)pObj);
    iVar4 = Frc_ObjSize(pFanLog);
    local_60 = iVar4 + local_60;
    *(int *)(pObjLog + 1) = *(int *)(pObjLog + 1) + 1;
    hHandle = hHandle + 1;
  }
  Gia_ManCleanMark0((Gia_Man_t *)p);
  iVar4 = Frc_ManNodeNum((Frc_Man_t *)pObjLog);
  if (k == iVar4) {
    if (nNodes != *(int *)(pObjLog + 1)) {
      __assert_fail("nObjs == p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaForce.c"
                    ,0x210,"Frc_Man_t *Frc_ManStart(Gia_Man_t *)");
    }
    if (local_60 != pObjLog[1].pPlace) {
      __assert_fail("hHandle == p->nObjData",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaForce.c"
                    ,0x211,"Frc_Man_t *Frc_ManStart(Gia_Man_t *)");
    }
    if (local_60 != pObjLog[1].pPlace) {
      printf("Frc_ManStart(): Fatal error in internal representation.\n");
    }
    hHandle = 0;
    do {
      bVar8 = false;
      if (hHandle < p->nObjs) {
        pFanin = Gia_ManObj((Gia_Man_t *)p,hHandle);
        bVar8 = pFanin != (Gia_Obj_t *)0x0;
      }
      if (!bVar8) {
        if (p[2].pObjData != (int *)0x0) {
          free(p[2].pObjData);
          p[2].pObjData = (int *)0x0;
        }
        return (Frc_Man_t *)pObjLog;
      }
      iVar4 = Gia_ObjValue(pFanin);
      pFVar1 = pObjLog;
      if (iVar4 != -1) {
        iVar4 = Gia_ObjValue(pFanin);
        pFanLog = Frc_ManObj((Frc_Man_t *)pFVar1,iVar4);
        if (*(uint *)pFanLog >> 4 != (pFanLog->field_9).iFanin) {
          __assert_fail("pObjLog->nFanins == pObjLog->iFanin",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaForce.c"
                        ,0x21a,"Frc_Man_t *Frc_ManStart(Gia_Man_t *)");
        }
        if (pFanLog->nFanouts != pFanLog->iFanout) {
          __assert_fail("pObjLog->nFanouts == pObjLog->iFanout",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaForce.c"
                        ,0x21b,"Frc_Man_t *Frc_ManStart(Gia_Man_t *)");
        }
        pFanLog->iFanout = 0;
        (pFanLog->field_9).fEdgeCenter = 0.0;
      }
      hHandle = hHandle + 1;
    } while( true );
  }
  __assert_fail("nNodes == Frc_ManNodeNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaForce.c"
                ,0x20f,"Frc_Man_t *Frc_ManStart(Gia_Man_t *)");
}

Assistant:

Frc_Man_t * Frc_ManStart( Gia_Man_t * pGia )
{
    Frc_Man_t * p;
    Frc_Obj_t * pObjLog, * pFanLog;
    Gia_Obj_t * pObj, * pFanin;//, * pObjRi, * pObjRo;
    Vec_Int_t * vSuper, * vVisit;
    int nObjs, nFanios, nNodes = 0;
    int i, k, hHandle = 0;
    // prepare the AIG
//    Gia_ManCreateRefs( pGia );
    Frc_ManCreateRefsSpecial( pGia );
    Frc_ManTransformRefs( pGia, &nObjs, &nFanios );
    Gia_ManFillValue( pGia );
    // create logic network
    p = ABC_CALLOC( Frc_Man_t, 1 );
    p->pGia  = pGia;
    p->nRegs = Gia_ManRegNum(pGia);
    p->vCis  = Vec_IntAlloc( Gia_ManCiNum(pGia) );
    p->vCos  = Vec_IntAlloc( Gia_ManCoNum(pGia) );
    p->nObjData = (sizeof(Frc_Obj_t) / 4) * nObjs + 2 * nFanios;
    p->pObjData = ABC_CALLOC( int, p->nObjData );
    // create constant node
    Gia_ManConst0(pGia)->Value = hHandle;
    pObjLog = Frc_ManObj( p, hHandle );
    pObjLog->hHandle  = hHandle;
    pObjLog->nFanins  = 0;
    pObjLog->nFanouts = Gia_ObjRefNum( pGia, Gia_ManConst0(pGia) );
    // count objects
    hHandle += Frc_ObjSize( pObjLog );
    nNodes++;
    p->nObjs++;
    // create the PIs
    Gia_ManForEachCi( pGia, pObj, i )
    {
        // create PI object
        pObj->Value = hHandle;
        Vec_IntPush( p->vCis, hHandle );
        pObjLog = Frc_ManObj( p, hHandle );
        pObjLog->hHandle  = hHandle;
        pObjLog->nFanins  = 0;
        pObjLog->nFanouts = Gia_ObjRefNum( pGia, pObj );
        pObjLog->fCi = 1;
        // count objects
        hHandle += Frc_ObjSize( pObjLog );
        p->nObjs++;
    }
    // create internal nodes
    vSuper = Vec_IntAlloc( 100 );
    vVisit = Vec_IntAlloc( 100 );
    Gia_ManForEachAnd( pGia, pObj, i )
    {
        if ( pObj->fMark0 == 0 )
        {
            assert( Gia_ObjRefNum( pGia, pObj ) == 0 );
            continue;
        }
        assert( Gia_ObjRefNum( pGia, pObj ) > 0 );
        Frc_ManCollectSuper( pGia, pObj, vSuper, vVisit );
        // create node object
        pObj->Value = hHandle;
        pObjLog = Frc_ManObj( p, hHandle );
        pObjLog->hHandle  = hHandle;
        pObjLog->nFanins  = Vec_IntSize( vSuper );
        pObjLog->nFanouts = Gia_ObjRefNum( pGia, pObj );
        // add fanins
        Gia_ManForEachObjVec( vSuper, pGia, pFanin, k )
        {
            pFanLog = Frc_ManObj( p, Gia_ObjValue(pFanin) ); 
            Frc_ObjAddFanin( pObjLog, pFanLog );
        }
        // count objects
        hHandle += Frc_ObjSize( pObjLog );
        nNodes++;
        p->nObjs++;
    }
    Vec_IntFree( vSuper );
    Vec_IntFree( vVisit );
    // create the POs
    Gia_ManForEachCo( pGia, pObj, i )
    {
        // create PO object
        pObj->Value = hHandle;
        Vec_IntPush( p->vCos, hHandle );
        pObjLog = Frc_ManObj( p, hHandle );
        pObjLog->hHandle  = hHandle;
        pObjLog->nFanins  = 1;
        pObjLog->nFanouts = 0;
        pObjLog->fCo = 1;
        // add fanins
        pFanLog = Frc_ManObj( p, Gia_ObjValue(Gia_ObjFanin0(pObj)) );
        Frc_ObjAddFanin( pObjLog, pFanLog );
        // count objects
        hHandle += Frc_ObjSize( pObjLog );
        p->nObjs++;
    }
    // connect registers
//    Gia_ManForEachRiRo( pGia, pObjRi, pObjRo, i )
//        Frc_ObjAddFanin( Frc_ManObj(p,Gia_ObjValue(pObjRo)), Frc_ManObj(p,Gia_ObjValue(pObjRi)) );
    Gia_ManCleanMark0( pGia );
    assert( nNodes  == Frc_ManNodeNum(p) );
    assert( nObjs   == p->nObjs );
    assert( hHandle == p->nObjData );
    if ( hHandle != p->nObjData )
        printf( "Frc_ManStart(): Fatal error in internal representation.\n" );
    // make sure the fanin/fanout counters are correct
    Gia_ManForEachObj( pGia, pObj, i )
    {
        if ( !~Gia_ObjValue(pObj) )
            continue;
        pObjLog = Frc_ManObj( p, Gia_ObjValue(pObj) );
        assert( pObjLog->nFanins  == pObjLog->iFanin );
        assert( pObjLog->nFanouts == pObjLog->iFanout );
        pObjLog->iFanin = pObjLog->iFanout = 0;
    }
    ABC_FREE( pGia->pRefs );
    return p;
}